

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

int32_t __thiscall icu_63::RuleBasedBreakIterator::next(RuleBasedBreakIterator *this,int32_t n)

{
  int local_18;
  int local_14;
  int32_t result;
  int32_t n_local;
  RuleBasedBreakIterator *this_local;
  
  local_18 = 0;
  local_14 = n;
  if (n < 1) {
    if (n < 0) {
      for (; local_14 < 0 && local_18 != -1; local_14 = local_14 + 1) {
        local_18 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xc])();
      }
    }
    else {
      local_18 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xe])();
    }
  }
  else {
    for (; 0 < local_14 && local_18 != -1; local_14 = local_14 + -1) {
      local_18 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0xd])();
    }
  }
  return local_18;
}

Assistant:

int32_t RuleBasedBreakIterator::next(int32_t n) {
    int32_t result = 0;
    if (n > 0) {
        for (; n > 0 && result != UBRK_DONE; --n) {
            result = next();
        }
    } else if (n < 0) {
        for (; n < 0 && result != UBRK_DONE; ++n) {
            result = previous();
        }
    } else {
        result = current();
    }
    return result;
}